

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O0

void __thiscall Fluid::apply_body_forces(Fluid *this,float dt)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  float *pfVar5;
  int *piVar6;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [8];
  vec3 body_force;
  float dt_local;
  Fluid *this_local;
  
  body_force.field_1.y = dt;
  unique0x100004ab = this;
  ssbo_barrier(this);
  gfx::Program::use(&this->body_forces_program);
  p_Var1 = glad_glUniform1f;
  body_force.field_0 =
       *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)&(this->gravity).field_2;
  local_20._0_4_ = (this->gravity).field_0;
  local_20._4_4_ = (this->gravity).field_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dt",&local_41);
  GVar4 = gfx::Program::uniform_loc(&this->body_forces_program,&local_40);
  (*p_Var1)(GVar4,body_force.field_1.y);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  p_Var2 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"bounds_min",&local_79);
  GVar4 = gfx::Program::uniform_loc(&this->body_forces_program,&local_78);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_min);
  (*p_Var2)(GVar4,1,pfVar5);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  p_Var2 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"bounds_max",&local_a1);
  GVar4 = gfx::Program::uniform_loc(&this->body_forces_program,&local_a0);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>(&this->bounds_max);
  (*p_Var2)(GVar4,1,pfVar5);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  p_Var3 = glad_glUniform3iv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"grid_dim",&local_c9);
  GVar4 = gfx::Program::uniform_loc(&this->body_forces_program,&local_c8);
  piVar6 = glm::value_ptr<int,(glm::qualifier)0>(&this->grid_dimensions);
  (*p_Var3)(GVar4,1,piVar6);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  p_Var2 = glad_glUniform3fv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"body_force",&local_f1);
  GVar4 = gfx::Program::uniform_loc(&this->body_forces_program,&local_f0);
  pfVar5 = glm::value_ptr<float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_20);
  (*p_Var2)(GVar4,1,pfVar5);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  gfx::Program::validate(&this->body_forces_program);
  (*glad_glDispatchCompute)
            ((this->grid_dimensions).field_0.x,(this->grid_dimensions).field_1.y,
             (this->grid_dimensions).field_2.z);
  gfx::Program::disuse(&this->body_forces_program);
  return;
}

Assistant:

void apply_body_forces(float dt) {
        // also enforces boundary condition
        ssbo_barrier();
        body_forces_program.use();
        const glm::vec3 body_force = gravity; // TODO: other forces?
        glUniform1f(body_forces_program.uniform_loc("dt"), dt);
        glUniform3fv(body_forces_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(body_forces_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(body_forces_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform3fv(body_forces_program.uniform_loc("body_force"), 1, glm::value_ptr(body_force));
        body_forces_program.validate();
        glDispatchCompute(grid_dimensions.x, grid_dimensions.y, grid_dimensions.z);
        body_forces_program.disuse();
    }